

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void txfm_quant_rdcost(MACROBLOCK *x,int16_t *src_diff,int diff_stride,uint8_t *src,int src_stride,
                      uint8_t *dst,int dst_stride,tran_low_t *coeff,tran_low_t *qcoeff,
                      tran_low_t *dqcoeff,int bw,int bh,TX_SIZE tx_size,int do_recon,int *rate_cost,
                      int64_t *recon_error,int64_t *sse)

{
  int iVar1;
  tran_low_t *dqcoeff_00;
  BitDepthInfo bd_info_00;
  ptrdiff_t in_RCX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  BitDepthInfo in_R9;
  tran_low_t *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  tran_low_t *in_stack_00000010;
  int in_stack_0000001c;
  MACROBLOCK *in_stack_00000020;
  uint16_t eob;
  BitDepthInfo bd_info;
  MACROBLOCKD *xd;
  int in_stack_00000040;
  MACROBLOCKD *in_stack_ffffffffffffff98;
  tran_low_t *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffbe;
  undefined4 in_stack_ffffffffffffffd8;
  int stride;
  int in_stack_ffffffffffffffe8;
  TX_SIZE tx_size_00;
  
  dqcoeff_00 = (tran_low_t *)(in_RDI + 0x1a0);
  bd_info_00 = get_bit_depth_info(in_stack_ffffffffffffff98);
  tx_size_00 = (TX_SIZE)((ulong)in_RDI >> 0x38);
  av1_subtract_block(bd_info_00,CONCAT22(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc),
                     in_stack_ffffffffffffffb8,(int16_t *)in_stack_ffffffffffffffb0,
                     (long)in_stack_00000008,(uint8_t *)in_R9,(ptrdiff_t)in_R9,
                     (uint8_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_RCX);
  stride = (int)in_RCX;
  av1_quick_txfm((int)((ulong)dqcoeff_00 >> 0x20),(TX_SIZE)((ulong)dqcoeff_00 >> 0x18),in_R9,
                 (int16_t *)bd_info_00,CONCAT22(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)
                 ,in_stack_ffffffffffffffb0);
  get_quantize_error(in_stack_00000020,in_stack_0000001c,in_stack_00000010,
                     (tran_low_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                     tx_size_00,(uint16_t *)xd,(int64_t *)dst,
                     (int64_t *)CONCAT44(src_stride,in_stack_00000040));
  iVar1 = rate_estimator(in_stack_ffffffffffffffb0,(int)((ulong)src_diff >> 0x20),
                         (TX_SIZE)((ulong)src_diff >> 0x18));
  *(int *)src = iVar1;
  if (in_stack_00000040 != 0) {
    av1_inverse_transform_block
              ((MACROBLOCKD *)in_R9,dqcoeff_00,bd_info_00.use_highbitdepth_buf,
               bd_info_00.bit_depth._3_1_,bd_info_00.bit_depth._2_1_,
               (uint8_t *)
               CONCAT26(in_stack_ffffffffffffffbe,
                        CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),stride,
               in_stack_ffffffffffffffe8,in_ESI);
  }
  return;
}

Assistant:

static inline void txfm_quant_rdcost(
    const MACROBLOCK *x, int16_t *src_diff, int diff_stride, uint8_t *src,
    int src_stride, uint8_t *dst, int dst_stride, tran_low_t *coeff,
    tran_low_t *qcoeff, tran_low_t *dqcoeff, int bw, int bh, TX_SIZE tx_size,
    int do_recon, int *rate_cost, int64_t *recon_error, int64_t *sse) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  uint16_t eob;
  av1_subtract_block(bd_info, bh, bw, src_diff, diff_stride, src, src_stride,
                     dst, dst_stride);
  av1_quick_txfm(/*use_hadamard=*/0, tx_size, bd_info, src_diff, bw, coeff);

  get_quantize_error(x, 0, coeff, qcoeff, dqcoeff, tx_size, &eob, recon_error,
                     sse);

  *rate_cost = rate_estimator(qcoeff, eob, tx_size);

  if (do_recon)
    av1_inverse_transform_block(xd, dqcoeff, 0, DCT_DCT, tx_size, dst,
                                dst_stride, eob, 0);
}